

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make_constant<bool,bool_const&>(any *this,bool *args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_00336018 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar1 = *(baseHolder **)
              (&holder<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>>::allocator +
              DAT_00336018 * 8);
    DAT_00336018 = DAT_00336018 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_003244d8;
  *(bool *)&pbVar1[1]._vptr_baseHolder = *args;
  if ((DAT_00339e90 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00339e90];
    DAT_00339e90 = DAT_00339e90 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 2;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}